

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall cmake::HandleDeleteCacheVariables(cmake *this,string *var)

{
  cmState *pcVar1;
  pointer pSVar2;
  bool bVar3;
  ProjectKind PVar4;
  int iVar5;
  ostream *poVar6;
  cmValue cVar7;
  string *psVar8;
  pointer pbVar9;
  SaveCacheEntry save;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> saved;
  cmList argsSplit;
  ostringstream warning;
  undefined1 local_260 [32];
  _Alloc_hider local_240;
  size_type local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Alloc_hider local_220;
  size_type local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  CacheEntryType local_200;
  string local_1f8;
  vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_> local_1d8;
  cmList local_1c0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  cmList::cmList(&local_1c0,var,Yes,Yes);
  pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
           super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"__CMAKE_DELETE_CACHE_CHANGE_VARS_","");
  local_260._0_8_ = local_260 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_260,"");
  cmState::SetGlobalProperty(pcVar1,(string *)local_1a8,(string *)local_260);
  if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
    operator_delete((void *)local_260._0_8_,CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
  }
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  PVar4 = cmState::GetProjectKind
                    ((this->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  iVar5 = 0;
  if (PVar4 != TryCompile) {
    local_1d8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1d8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1d8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,
               "You have changed variables that require your cache to be deleted.\nConfigure will be re-run and you may have to reset some variables.\nThe following variables have changed:\n"
               ,0xab);
    if (local_1c0.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1c0.Values.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar9 = local_1c0.Values.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_260._0_8_ = local_260 + 0x10;
        local_260._8_8_ = 0;
        local_260[0x10] = '\0';
        local_240._M_p = (pointer)&local_230;
        local_238 = 0;
        local_230._M_local_buf[0] = '\0';
        local_220._M_p = (pointer)&local_210;
        local_218 = 0;
        local_210._M_local_buf[0] = '\0';
        std::__cxx11::string::_M_assign((string *)local_260);
        poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a8,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar6,"= ",2);
        if (pbVar9 + 1 ==
            local_1c0.Values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          local_1f8._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)&local_1f8,1);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_240);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,pbVar9[1]._M_dataplus._M_p,
                              pbVar9[1]._M_string_length);
          local_1f8._M_dataplus._M_p._0_1_ = 10;
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)&local_1f8,1);
          pbVar9 = pbVar9 + 1;
        }
        cVar7 = cmState::GetCacheEntryValue
                          ((this->State)._M_t.
                           super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                           super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                           super__Head_base<0UL,_cmState_*,_false>._M_head_impl,(string *)local_260)
        ;
        if (cVar7.Value == (string *)0x0) {
          local_200 = UNINITIALIZED;
        }
        else {
          local_200 = cmState::GetCacheEntryType
                                ((this->State)._M_t.
                                 super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                                 super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
                                 (string *)local_260);
          pcVar1 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>.
                   _M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                   super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"HELPSTRING","");
          cVar7 = cmState::GetCacheEntryProperty(pcVar1,(string *)local_260,&local_1f8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
            operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
          }
          if (cVar7.Value != (string *)0x0) {
            std::__cxx11::string::_M_assign((string *)&local_220);
          }
        }
        std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::emplace_back<SaveCacheEntry>
                  (&local_1d8,(SaveCacheEntry *)local_260);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_220._M_p != &local_210) {
          operator_delete(local_220._M_p,
                          CONCAT71(local_210._M_allocated_capacity._1_7_,local_210._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_p != &local_230) {
          operator_delete(local_240._M_p,
                          CONCAT71(local_230._M_allocated_capacity._1_7_,local_230._M_local_buf[0])
                          + 1);
        }
        if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
          operator_delete((void *)local_260._0_8_,CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
        }
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != local_1c0.Values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    psVar8 = cmState::GetBinaryDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    cmState::DeleteCache
              ((this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t
               .super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
               super__Head_base<0UL,_cmState_*,_false>._M_head_impl,psVar8);
    LoadCache(this);
    pSVar2 = local_1d8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (local_1d8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_1d8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      cVar7.Value = &(local_1d8.super__Vector_base<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>.
                      _M_impl.super__Vector_impl_data._M_start)->help;
      do {
        AddCacheEntry(this,cVar7.Value + -2,cVar7.Value + -1,cVar7,
                      *(int *)&cVar7.Value[1]._M_dataplus._M_p);
        psVar8 = cVar7.Value + 1;
        cVar7.Value = (string *)&cVar7.Value[3]._M_string_length;
      } while ((pointer)&psVar8->_M_string_length != pSVar2);
    }
    std::__cxx11::stringbuf::str();
    cmSystemTools::Message((string *)local_260,(char *)0x0);
    if ((undefined1 *)local_260._0_8_ != local_260 + 0x10) {
      operator_delete((void *)local_260._0_8_,CONCAT71(local_260._17_7_,local_260[0x10]) + 1);
    }
    iVar5 = 0;
    if ((cmSystemTools::s_ErrorOccurred == false) &&
       (iVar5 = 0, cmSystemTools::s_FatalErrorOccurred == false)) {
      bVar3 = cmSystemTools::GetInterruptFlag();
      if (!bVar3) {
        iVar5 = Configure(this);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    std::vector<SaveCacheEntry,_std::allocator<SaveCacheEntry>_>::~vector(&local_1d8);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c0.Values);
  return iVar5;
}

Assistant:

int cmake::HandleDeleteCacheVariables(const std::string& var)
{
  cmList argsSplit{ var, cmList::EmptyElements::Yes };
  // erase the property to avoid infinite recursion
  this->State->SetGlobalProperty("__CMAKE_DELETE_CACHE_CHANGE_VARS_", "");
  if (this->GetIsInTryCompile()) {
    return 0;
  }
  std::vector<SaveCacheEntry> saved;
  std::ostringstream warning;
  warning
    << "You have changed variables that require your cache to be deleted.\n"
       "Configure will be re-run and you may have to reset some variables.\n"
       "The following variables have changed:\n";
  for (auto i = argsSplit.begin(); i != argsSplit.end(); ++i) {
    SaveCacheEntry save;
    save.key = *i;
    warning << *i << "= ";
    i++;
    if (i != argsSplit.end()) {
      save.value = *i;
      warning << *i << '\n';
    } else {
      warning << '\n';
      i -= 1;
    }
    cmValue existingValue = this->State->GetCacheEntryValue(save.key);
    if (existingValue) {
      save.type = this->State->GetCacheEntryType(save.key);
      if (cmValue help =
            this->State->GetCacheEntryProperty(save.key, "HELPSTRING")) {
        save.help = *help;
      }
    } else {
      save.type = cmStateEnums::CacheEntryType::UNINITIALIZED;
    }
    saved.push_back(std::move(save));
  }

  // remove the cache
  this->DeleteCache(this->GetHomeOutputDirectory());
  // load the empty cache
  this->LoadCache();
  // restore the changed compilers
  for (SaveCacheEntry const& i : saved) {
    this->AddCacheEntry(i.key, i.value, i.help, i.type);
  }
  cmSystemTools::Message(warning.str());
  // avoid reconfigure if there were errors
  if (!cmSystemTools::GetErrorOccurredFlag()) {
    // re-run configure
    return this->Configure();
  }
  return 0;
}